

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_cluster_inform_root_about_channel(channel_s *ch,int add)

{
  fio_match_fn p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [24];
  undefined1 auVar5 [24];
  fio_msg_internal_s *m_;
  fio_str_info_s msg;
  char buf [8];
  fio_str_info_s ch_name;
  
  if ((((fio_data->is_worker != '\0') && (ch != (channel_s *)0x0)) && (fio_data->workers != 1)) &&
     (cluster_data.uuid != 0)) {
    uVar2 = ch->name_len;
    uVar3 = ch->name;
    auVar4._8_8_ = uVar3;
    auVar4._0_8_ = uVar2;
    msg.data = (char *)0x0;
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    msg.len = 0;
    p_Var1 = ch->match;
    if (p_Var1 != (fio_match_fn)0x0) {
      buf = (char  [8])
            ((ulong)p_Var1 >> 0x38 | ((ulong)p_Var1 & 0xff000000000000) >> 0x28 |
             ((ulong)p_Var1 & 0xff0000000000) >> 0x18 | ((ulong)p_Var1 & 0xff00000000) >> 8 |
             ((ulong)p_Var1 & 0xff000000) << 8 | ((ulong)p_Var1 & 0xff0000) << 0x18 |
             ((ulong)p_Var1 & 0xff00) << 0x28 | (long)p_Var1 << 0x38);
      msg.data = buf;
      msg.len = 8;
    }
    auVar4._16_8_ = 0;
    auVar5._8_8_ = msg.data;
    auVar5._0_8_ = msg.len;
    auVar5._16_8_ = 0;
    m_ = fio_msg_internal_create
                   (0,(uint)(add == 0) + (uint)(p_Var1 != (fio_match_fn)0x0) * 2 + 4,
                    (fio_str_info_s)(auVar4 << 0x40),(fio_str_info_s)(auVar5 << 0x40),'\0','\x01');
    fio_cluster_client_sender(m_,-1);
  }
  return;
}

Assistant:

static inline void fio_cluster_inform_root_about_channel(channel_s *ch,
                                                         int add) {
  if (!fio_data->is_worker || fio_data->workers == 1 || !cluster_data.uuid ||
      !ch)
    return;
  fio_str_info_s ch_name = {.data = ch->name, .len = ch->name_len};
  fio_str_info_s msg = {.data = NULL, .len = 0};
#if DEBUG
  FIO_LOG_DEBUG("(%d) informing root about: %s (%zu) msg type %d",
                (int)getpid(), ch_name.data, ch_name.len,
                (ch->match ? (add ? FIO_CLUSTER_MSG_PATTERN_SUB
                                  : FIO_CLUSTER_MSG_PATTERN_UNSUB)
                           : (add ? FIO_CLUSTER_MSG_PUBSUB_SUB
                                  : FIO_CLUSTER_MSG_PUBSUB_UNSUB)));
#endif
  char buf[8] = {0};
  if (ch->match) {
    fio_u2str64(buf, (uint64_t)ch->match);
    msg.data = buf;
    msg.len = sizeof(ch->match);
  }

  fio_cluster_client_sender(
      fio_msg_internal_create(0,
                              (ch->match
                                   ? (add ? FIO_CLUSTER_MSG_PATTERN_SUB
                                          : FIO_CLUSTER_MSG_PATTERN_UNSUB)
                                   : (add ? FIO_CLUSTER_MSG_PUBSUB_SUB
                                          : FIO_CLUSTER_MSG_PUBSUB_UNSUB)),
                              ch_name, msg, 0, 1),
      -1);
}